

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

void curl_easy_reset(Curl_easy *data)

{
  int *piVar1;
  
  Curl_free_request_state(data);
  Curl_freeset(data);
  memset(&data->set,0,0x980);
  Curl_init_userdefined(data);
  memset(&data->progress,0,0x188);
  Curl_initinfo(data);
  piVar1 = &(data->progress).flags;
  *(byte *)piVar1 = (byte)*piVar1 | 0x10;
  (data->state).current_speed = -1;
  (data->state).retrycount = 0;
  (data->state).authhost.want = 0;
  (data->state).authhost.picked = 0;
  (data->state).authhost.avail = 0;
  *(undefined8 *)&(data->state).authhost.field_0x18 = 0;
  (data->state).authproxy.want = 0;
  (data->state).authproxy.picked = 0;
  (data->state).authproxy.avail = 0;
  *(undefined8 *)&(data->state).authproxy.field_0x18 = 0;
  Curl_http_auth_cleanup_digest(data);
  return;
}

Assistant:

void curl_easy_reset(struct Curl_easy *data)
{
  Curl_free_request_state(data);

  /* zero out UserDefined data: */
  Curl_freeset(data);
  memset(&data->set, 0, sizeof(struct UserDefined));
  (void)Curl_init_userdefined(data);

  /* zero out Progress data: */
  memset(&data->progress, 0, sizeof(struct Progress));

  /* zero out PureInfo data: */
  Curl_initinfo(data);

  data->progress.flags |= PGRS_HIDE;
  data->state.current_speed = -1; /* init to negative == impossible */
  data->state.retrycount = 0;     /* reset the retry counter */

  /* zero out authentication data: */
  memset(&data->state.authhost, 0, sizeof(struct auth));
  memset(&data->state.authproxy, 0, sizeof(struct auth));

#if !defined(CURL_DISABLE_HTTP) && !defined(CURL_DISABLE_CRYPTO_AUTH)
  Curl_http_auth_cleanup_digest(data);
#endif
}